

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testTranslationRotationMatrix<float>(M44d *mat)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  uint __line;
  int iVar6;
  ostream *s;
  char *__assertion;
  long lVar7;
  bool bVar8;
  vector<float,_std::allocator<float>_> weights;
  double dStack_200;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> to;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> from;
  Vec3<double> local_1b8;
  V3d b2;
  V3d b1;
  undefined1 local_158 [16];
  double local_148;
  M44d m1;
  M44d m2;
  
  s = std::operator<<((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ");
  Imath_2_5::operator<<(s,mat);
  if (testTranslationRotationMatrix<float>(Imath_2_5::Matrix44<double>const&)::rand == '\0') {
    iVar6 = __cxa_guard_acquire(&testTranslationRotationMatrix<float>(Imath_2_5::Matrix44<double>const&)
                                 ::rand);
    if (iVar6 != 0) {
      testTranslationRotationMatrix<float>::rand._state[0] = 0xee01;
      testTranslationRotationMatrix<float>::rand._state[1] = 0xdfad;
      testTranslationRotationMatrix<float>::rand._state[2] = 0xee01;
      __cxa_guard_release(&testTranslationRotationMatrix<float>(Imath_2_5::Matrix44<double>const&)::
                           rand);
    }
  }
  from.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  from.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  from.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::reserve(&from,7);
  to.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  to.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  to.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 7;
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::reserve(&to,7);
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    dVar2 = (double)Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    dVar3 = (double)Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    m1.x[0][2] = (double)Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    m1.x[0][0] = dVar2;
    m1.x[0][1] = dVar3;
    Imath_2_5::operator*((Vec3<double> *)&m1,mat);
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44((float)m1.x[0][1],(float)m1.x[0][0]);
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = (float)m1.x[0][2];
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&from,
               (Vec3<float> *)&weights);
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44((float)m2.x[0][1],(float)m2.x[0][0]);
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = (float)m2.x[0][2];
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&to,
               (Vec3<float> *)&weights);
  }
  m1.x[0][0] = (double)CONCAT44(m1.x[0][0]._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::vector
            (&weights,7,(value_type_conflict1 *)&m1,(allocator_type *)&m2);
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((Vec3 *)&m1,
             (Vec3 *)from.
                     super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             &(to.
               super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,true);
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((Vec3 *)&m2,
             (Vec3 *)from.
                     super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (ulong)to.
                    super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,true);
  lVar7 = 8;
  while( true ) {
    if (lVar7 == 0x5c) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&weights.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::
      ~_Vector_base(&to.
                     super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                   );
      std::_Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::
      ~_Vector_base(&from.
                     super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                   );
      return;
    }
    uVar1 = *(undefined8 *)
             ((long)from.
                    super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
    dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
    local_158._8_4_ = SUB84(dVar2,0);
    local_158._0_8_ = (double)(float)uVar1;
    local_158._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_148 = (double)*(float *)((long)&(from.
                                           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
    uVar1 = *(undefined8 *)
             ((long)to.
                    super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
    dVar2 = (double)(float)uVar1;
    dVar3 = (double)(float)((ulong)uVar1 >> 0x20);
    auVar4._8_4_ = SUB84(dVar3,0);
    auVar4._0_8_ = dVar2;
    auVar4._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)*(float *)((long)&(to.
                                       super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
    Imath_2_5::operator*((Vec3<double> *)local_158,&m1);
    Imath_2_5::operator*((Vec3<double> *)local_158,&m2);
    local_1b8.z = dVar3 - b1.z;
    dStack_200 = auVar4._8_8_;
    local_1b8.x = dVar2 - b1.x;
    local_1b8.y = dStack_200 - b1.y;
    dVar5 = Imath_2_5::Vec3<double>::length(&local_1b8);
    if (9.999999747378752e-05 <= dVar5) break;
    local_1b8.z = dVar3 - b2.z;
    local_1b8.x = dVar2 - b2.x;
    local_1b8.y = dStack_200 - b2.y;
    dVar2 = Imath_2_5::Vec3<double>::length(&local_1b8);
    if (9.999999747378752e-05 <= dVar2) {
      __assertion = "(b - b2).length() < eps";
      __line = 0x54;
      goto LAB_00131421;
    }
    lVar7 = lVar7 + 0xc;
  }
  __assertion = "(b - b1).length() < eps";
  __line = 0x53;
LAB_00131421:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                ,__line,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = float]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t numPoints = 7;
    std::vector<Vec> from;  from.reserve (numPoints);
    std::vector<Vec> to;    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (rand.nextf(), rand.nextf(), rand.nextf());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec(a));
        to.push_back (Vec(b));
    }

    std::vector<T> weights (numPoints, T(1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 = procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof(T) == 8 ? 1e-8 : 1e-4;
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length() < eps);
        assert ((b - b2).length() < eps);
    }
    std::cout << "  OK\n";
}